

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlPopMatrix(void)

{
  Matrix *pMVar1;
  Matrix *pMVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  long lVar18;
  
  lVar18 = (long)RLGL.State.stackCounter;
  if (0 < lVar18) {
    pMVar1 = RLGL.State.stack + lVar18 + -1;
    fVar14 = pMVar1->m0;
    fVar15 = pMVar1->m4;
    pMVar1 = RLGL.State.stack + lVar18 + -1;
    fVar16 = pMVar1->m8;
    fVar17 = pMVar1->m12;
    pMVar1 = RLGL.State.stack + lVar18 + -1;
    fVar10 = pMVar1->m1;
    fVar11 = pMVar1->m5;
    pMVar1 = RLGL.State.stack + lVar18 + -1;
    fVar12 = pMVar1->m9;
    fVar13 = pMVar1->m13;
    pMVar1 = RLGL.State.stack + lVar18 + -1;
    fVar6 = pMVar1->m2;
    fVar7 = pMVar1->m6;
    pMVar1 = RLGL.State.stack + lVar18 + -1;
    fVar8 = pMVar1->m10;
    fVar9 = pMVar1->m14;
    pMVar1 = RLGL.State.stack + lVar18 + -1;
    fVar3 = pMVar1->m7;
    pMVar2 = RLGL.State.stack + lVar18 + -1;
    fVar4 = pMVar2->m11;
    fVar5 = pMVar2->m15;
    pMVar2 = RLGL.State.currentMatrix;
    pMVar2->m3 = pMVar1->m3;
    pMVar2->m7 = fVar3;
    pMVar2->m11 = fVar4;
    pMVar2->m15 = fVar5;
    pMVar2->m2 = fVar6;
    pMVar2->m6 = fVar7;
    pMVar2->m10 = fVar8;
    pMVar2->m14 = fVar9;
    pMVar2->m1 = fVar10;
    pMVar2->m5 = fVar11;
    pMVar2->m9 = fVar12;
    pMVar2->m13 = fVar13;
    pMVar2->m0 = fVar14;
    pMVar2->m4 = fVar15;
    pMVar2->m8 = fVar16;
    pMVar2->m12 = fVar17;
    RLGL.State.stackCounter = RLGL.State.stackCounter + -1;
  }
  if ((RLGL.State.stackCounter == 0) && (RLGL.State.currentMatrixMode == 0x1700)) {
    RLGL.State.currentMatrix = &RLGL.State.modelview;
    RLGL.State.transformRequired = false;
  }
  return;
}

Assistant:

void rlPopMatrix(void)
{
    if (RLGL.State.stackCounter > 0)
    {
        Matrix mat = RLGL.State.stack[RLGL.State.stackCounter - 1];
        *RLGL.State.currentMatrix = mat;
        RLGL.State.stackCounter--;
    }

    if ((RLGL.State.stackCounter == 0) && (RLGL.State.currentMatrixMode == RL_MODELVIEW))
    {
        RLGL.State.currentMatrix = &RLGL.State.modelview;
        RLGL.State.transformRequired = false;
    }
}